

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ArrayWithPreallocation.h
# Opt level: O3

void __thiscall
soul::ArrayWithPreallocation<soul::Value,_4UL>::reserve
          (ArrayWithPreallocation<soul::Value,_4UL> *this,size_t minSize)

{
  Value *pVVar1;
  Value *pVVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  
  uVar5 = this->numAllocated;
  if (uVar5 < minSize) {
    uVar3 = minSize + 0xf & 0xfffffffffffffff0;
    if (uVar3 != 0) {
      pVVar2 = (Value *)operator_new__(uVar3 << 6);
      if (this->numActive != 0) {
        lVar4 = 0x20;
        uVar5 = 0;
        do {
          pVVar1 = this->items;
          *(undefined4 *)((long)(&(pVVar2->allocatedData).allocatedData + -2) + lVar4) =
               *(undefined4 *)((long)(&(pVVar1->allocatedData).allocatedData + -2) + lVar4);
          *(undefined4 *)((long)(pVVar2->allocatedData).allocatedData.space + lVar4 + -0x54) =
               *(undefined4 *)((long)(pVVar1->allocatedData).allocatedData.space + lVar4 + -0x54);
          *(undefined8 *)((long)(pVVar2->allocatedData).allocatedData.space + lVar4 + -0x50) =
               *(undefined8 *)((long)(pVVar1->allocatedData).allocatedData.space + lVar4 + -0x50);
          *(undefined8 *)((long)(&pVVar2->allocatedData + -1) + lVar4) =
               *(undefined8 *)((long)(&pVVar1->allocatedData + -1) + lVar4);
          *(undefined8 *)((long)(&pVVar1->allocatedData + -1) + lVar4) = 0;
          *(undefined8 *)((long)(pVVar2->allocatedData).allocatedData.space + lVar4 + -0x40) =
               *(undefined8 *)((long)(pVVar1->allocatedData).allocatedData.space + lVar4 + -0x40);
          ArrayWithPreallocation<unsigned_char,_8UL>::ArrayWithPreallocation
                    ((ArrayWithPreallocation<unsigned_char,_8UL> *)
                     ((long)(&(pVVar2->allocatedData).allocatedData + -1) + lVar4),
                     (ArrayWithPreallocation<unsigned_char,_8UL> *)
                     ((long)(&(pVVar1->allocatedData).allocatedData + -1) + lVar4));
          soul::Value::~Value((Value *)((long)(&(this->items->allocatedData).allocatedData + -2) +
                                       lVar4));
          uVar5 = uVar5 + 1;
          lVar4 = lVar4 + 0x40;
        } while (uVar5 < this->numActive);
        uVar5 = this->numAllocated;
      }
      if ((4 < uVar5) && (this->items != (Value *)0x0)) {
        operator_delete__(this->items);
      }
      this->items = pVVar2;
    }
    this->numAllocated = uVar3;
  }
  return;
}

Assistant:

void reserve (size_t minSize)
    {
        if (minSize > numAllocated)
        {
            minSize = getAlignedSize<16> (minSize);

            if (minSize > preallocatedItems)
            {
                auto* newObjects = reinterpret_cast<Item*> (new char[minSize * sizeof (Item)]);

                for (size_t i = 0; i < numActive; ++i)
                {
                    new (newObjects + i) Item (std::move (items[i]));
                    items[i].~Item();
                }

                freeIfHeapAllocated();
                items = newObjects;
            }

            numAllocated = minSize;
        }
    }